

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threadpool.c
# Opt level: O3

void init_once(void)

{
  int iVar1;
  char *__nptr;
  uint uVar2;
  long lVar3;
  ulong uVar4;
  uv_thread_options_t config;
  uv_sem_t sem;
  uv_thread_options_t local_60;
  uv_sem_t local_50;
  
  nthreads = 4;
  __nptr = getenv("UV_THREADPOOL_SIZE");
  if (__nptr != (char *)0x0) {
    nthreads = atoi(__nptr);
    if (nthreads == 0) {
      nthreads = 1;
    }
    else {
      if (nthreads < 0x401) {
        threads = default_threads;
        if (nthreads < 5) goto LAB_001e1757;
      }
      else {
        nthreads = 0x400;
      }
      threads = default_threads;
      threads = (uv_thread_t *)uv__malloc((ulong)(nthreads << 3));
      if (threads != (uv_thread_t *)0x0) goto LAB_001e1757;
      nthreads = 4;
    }
  }
  threads = default_threads;
LAB_001e1757:
  iVar1 = uv_cond_init(&cond);
  if ((iVar1 == 0) && (iVar1 = uv_mutex_init(&mutex), iVar1 == 0)) {
    wq.next = &wq;
    wq.prev = &wq;
    slow_io_pending_wq.next = &slow_io_pending_wq;
    slow_io_pending_wq.prev = &slow_io_pending_wq;
    run_slow_work_message.next = &run_slow_work_message;
    run_slow_work_message.prev = &run_slow_work_message;
    iVar1 = uv_sem_init(&local_50,0);
    if (iVar1 == 0) {
      local_60.flags = 1;
      local_60.stack_size = 0x800000;
      if (nthreads != 0) {
        lVar3 = 0;
        uVar4 = 0;
        do {
          iVar1 = uv_thread_create_ex((uv_thread_t *)((long)threads + lVar3),&local_60,worker,
                                      &local_50);
          if (iVar1 != 0) goto LAB_001e1867;
          uVar4 = uVar4 + 1;
          lVar3 = lVar3 + 8;
        } while (uVar4 < nthreads);
        if (nthreads != 0) {
          uVar2 = 0;
          do {
            uv_sem_wait(&local_50);
            uVar2 = uVar2 + 1;
          } while (uVar2 < nthreads);
        }
      }
      uv_sem_destroy(&local_50);
      return;
    }
  }
LAB_001e1867:
  abort();
}

Assistant:

static void init_once(void) {
  uv_thread_options_t config;
  unsigned int i;
  const char* val;
  uv_sem_t sem;

  nthreads = ARRAY_SIZE(default_threads);
  val = getenv("UV_THREADPOOL_SIZE");
  if (val != NULL)
    nthreads = atoi(val);
  if (nthreads == 0)
    nthreads = 1;
  if (nthreads > MAX_THREADPOOL_SIZE)
    nthreads = MAX_THREADPOOL_SIZE;

  threads = default_threads;
  if (nthreads > ARRAY_SIZE(default_threads)) {
    threads = uv__malloc(nthreads * sizeof(threads[0]));
    if (threads == NULL) {
      nthreads = ARRAY_SIZE(default_threads);
      threads = default_threads;
    }
  }

  if (uv_cond_init(&cond))
    abort();

  if (uv_mutex_init(&mutex))
    abort();

  uv__queue_init(&wq);
  uv__queue_init(&slow_io_pending_wq);
  uv__queue_init(&run_slow_work_message);

  if (uv_sem_init(&sem, 0))
    abort();

  config.flags = UV_THREAD_HAS_STACK_SIZE;
  config.stack_size = 8u << 20;  /* 8 MB */

  for (i = 0; i < nthreads; i++)
    if (uv_thread_create_ex(threads + i, &config, worker, &sem))
      abort();

  for (i = 0; i < nthreads; i++)
    uv_sem_wait(&sem);

  uv_sem_destroy(&sem);
}